

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum256_32.c
# Opt level: O3

void Hacl_Bignum256_32_sqr(uint32_t *a,uint32_t *res)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  uint32_t i;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  uint auStack_54 [3];
  uint32_t tmp [16];
  
  res[0xc] = 0;
  res[0xd] = 0;
  res[0xe] = 0;
  res[0xf] = 0;
  res[8] = 0;
  res[9] = 0;
  res[10] = 0;
  res[0xb] = 0;
  res[4] = 0;
  res[5] = 0;
  res[6] = 0;
  res[7] = 0;
  res[0] = 0;
  res[1] = 0;
  res[2] = 0;
  res[3] = 0;
  *(ulong *)(res + 1) = (ulong)*a * (ulong)a[1];
  uVar2 = a[2];
  lVar8 = 0;
  uVar9 = 0;
  bVar15 = true;
  do {
    bVar7 = bVar15;
    uVar13 = res[lVar8 + 2] + uVar9 + (ulong)a[lVar8] * (ulong)uVar2;
    res[lVar8 + 2] = (uint32_t)uVar13;
    uVar9 = uVar13 >> 0x20;
    lVar8 = 1;
    bVar15 = false;
  } while (bVar7);
  res[4] = (uint32_t)(uVar13 >> 0x20);
  uVar2 = a[3];
  lVar8 = 0;
  uVar9 = 0;
  do {
    uVar13 = res[lVar8 + 3] + uVar9 + (ulong)a[lVar8] * (ulong)uVar2;
    res[lVar8 + 3] = (uint32_t)uVar13;
    uVar9 = uVar13 >> 0x20;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  res[6] = (uint32_t)(uVar13 >> 0x20);
  uVar13 = (ulong)a[4];
  uVar10 = *a * uVar13 + (ulong)res[4];
  res[4] = (uint32_t)uVar10;
  uVar10 = a[1] * uVar13 + (ulong)res[5] + (uVar10 >> 0x20);
  res[5] = (uint32_t)uVar10;
  uVar11 = a[2] * uVar13 + uVar9 + (uVar10 >> 0x20);
  res[6] = (uint32_t)uVar11;
  uVar9 = a[3] * uVar13 + (ulong)res[7] + (uVar11 >> 0x20);
  *(ulong *)(res + 7) = uVar9;
  uVar13 = (ulong)a[5];
  uVar10 = (uVar10 & 0xffffffff) + *a * uVar13;
  res[5] = (uint32_t)uVar10;
  uVar10 = (uVar11 & 0xffffffff) + a[1] * uVar13 + (uVar10 >> 0x20);
  res[6] = (uint32_t)uVar10;
  uVar11 = (uVar9 & 0xffffffff) + a[2] * uVar13 + (uVar10 >> 0x20);
  res[7] = (uint32_t)uVar11;
  uVar14 = a[3] * uVar13 + (uVar9 >> 0x20) + (uVar11 >> 0x20);
  res[8] = (uint32_t)uVar14;
  uVar12 = a[4] * uVar13 + (ulong)res[9] + (uVar14 >> 0x20);
  *(ulong *)(res + 9) = uVar12;
  uVar9 = (ulong)a[6];
  uVar13 = (uVar10 & 0xffffffff) + *a * uVar9;
  res[6] = (uint32_t)uVar13;
  uVar13 = (uVar11 & 0xffffffff) + a[1] * uVar9 + (uVar13 >> 0x20);
  res[7] = (uint32_t)uVar13;
  uVar13 = (uVar14 & 0xffffffff) + a[2] * uVar9 + (uVar13 >> 0x20);
  res[8] = (uint32_t)uVar13;
  uVar13 = (uVar12 & 0xffffffff) + a[3] * uVar9 + (uVar13 >> 0x20);
  res[9] = (uint32_t)uVar13;
  lVar8 = 0;
  do {
    uVar13 = a[lVar8 + 4] * uVar9 + (ulong)res[lVar8 + 10] + (uVar13 >> 0x20);
    res[lVar8 + 10] = (uint32_t)uVar13;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 2);
  res[0xc] = (uint32_t)(uVar13 >> 0x20);
  uVar9 = (ulong)a[7];
  uVar13 = *a * uVar9 + (ulong)res[7];
  res[7] = (uint32_t)uVar13;
  uVar13 = a[1] * uVar9 + (ulong)res[8] + (uVar13 >> 0x20);
  res[8] = (uint32_t)uVar13;
  uVar13 = a[2] * uVar9 + (ulong)res[9] + (uVar13 >> 0x20);
  res[9] = (uint32_t)uVar13;
  uVar13 = a[3] * uVar9 + (ulong)res[10] + (uVar13 >> 0x20);
  res[10] = (uint32_t)uVar13;
  lVar8 = 0;
  do {
    uVar13 = a[lVar8 + 4] * uVar9 + (ulong)res[lVar8 + 0xb] + (uVar13 >> 0x20);
    res[lVar8 + 0xb] = (uint32_t)uVar13;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  res[0xe] = (uint32_t)(uVar13 >> 0x20);
  lVar8 = 0;
  bVar15 = false;
  do {
    uVar2 = *(uint *)((long)res + lVar8);
    uVar3 = *(uint *)((long)res + lVar8 + 4);
    *(uint *)((long)res + lVar8) = uVar2 * 2 + (uint)bVar15;
    uVar4 = (uint)(CARRY4(uVar2,uVar2) || CARRY4(uVar2 * 2,(uint)bVar15));
    *(uint *)((long)res + lVar8 + 4) = uVar3 * 2 + uVar4;
    uVar2 = *(uint *)((long)res + lVar8 + 8);
    uVar4 = (uint)(CARRY4(uVar3,uVar3) || CARRY4(uVar3 * 2,uVar4));
    *(uint *)((long)res + lVar8 + 8) = uVar2 * 2 + uVar4;
    uVar3 = *(uint *)((long)res + lVar8 + 0xc);
    uVar2 = (uint)(CARRY4(uVar2,uVar2) || CARRY4(uVar2 * 2,uVar4));
    bVar15 = CARRY4(uVar3,uVar3) || CARRY4(uVar3 * 2,uVar2);
    *(uint *)((long)res + lVar8 + 0xc) = uVar3 * 2 + uVar2;
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x40);
  tmp._0_8_ = (ulong)*a * (ulong)*a;
  tmp._8_8_ = (ulong)a[1] * (ulong)a[1];
  tmp._16_8_ = (ulong)a[2] * (ulong)a[2];
  tmp._24_8_ = (ulong)a[3] * (ulong)a[3];
  tmp._32_8_ = (ulong)a[4] * (ulong)a[4];
  tmp._40_8_ = (ulong)a[5] * (ulong)a[5];
  tmp._48_8_ = (ulong)a[6] * (ulong)a[6];
  tmp._56_8_ = (ulong)a[7] * (ulong)a[7];
  lVar8 = 0xc;
  bVar15 = false;
  do {
    uVar3 = *(uint *)((long)auStack_54 + lVar8);
    puVar1 = (uint *)((long)res + lVar8 + -0xc);
    uVar2 = *puVar1;
    uVar5 = *puVar1 + uVar3;
    *puVar1 = uVar5 + bVar15;
    uVar4 = *(uint *)((long)auStack_54 + lVar8 + 4);
    puVar1 = (uint *)((long)res + lVar8 + -8);
    uVar5 = (uint)(CARRY4(uVar2,uVar3) || CARRY4(uVar5,(uint)bVar15));
    uVar2 = *puVar1;
    uVar6 = *puVar1 + uVar4;
    *puVar1 = uVar6 + uVar5;
    uVar3 = *(uint *)((long)auStack_54 + lVar8 + 8);
    puVar1 = (uint *)((long)res + lVar8 + -4);
    uVar4 = (uint)(CARRY4(uVar2,uVar4) || CARRY4(uVar6,uVar5));
    uVar2 = *puVar1;
    uVar5 = *puVar1 + uVar3;
    *puVar1 = uVar5 + uVar4;
    puVar1 = (uint *)((long)res + lVar8);
    uVar2 = (uint)(CARRY4(uVar2,uVar3) || CARRY4(uVar5,uVar4));
    uVar3 = *puVar1 + *(uint *)((long)tmp + lVar8);
    bVar15 = CARRY4(*puVar1,*(uint *)((long)tmp + lVar8)) || CARRY4(uVar3,uVar2);
    *puVar1 = uVar3 + uVar2;
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x4c);
  return;
}

Assistant:

void Hacl_Bignum256_32_sqr(uint32_t *a, uint32_t *res)
{
  memset(res, 0U, 16U * sizeof (uint32_t));
  KRML_MAYBE_FOR8(i0,
    0U,
    8U,
    1U,
    uint32_t *ab = a;
    uint32_t a_j = a[i0];
    uint32_t *res_j = res + i0;
    uint32_t c = 0U;
    for (uint32_t i = 0U; i < i0 / 4U; i++)
    {
      uint32_t a_i = ab[4U * i];
      uint32_t *res_i0 = res_j + 4U * i;
      c = Hacl_Bignum_Base_mul_wide_add2_u32(a_i, a_j, c, res_i0);
      uint32_t a_i0 = ab[4U * i + 1U];
      uint32_t *res_i1 = res_j + 4U * i + 1U;
      c = Hacl_Bignum_Base_mul_wide_add2_u32(a_i0, a_j, c, res_i1);
      uint32_t a_i1 = ab[4U * i + 2U];
      uint32_t *res_i2 = res_j + 4U * i + 2U;
      c = Hacl_Bignum_Base_mul_wide_add2_u32(a_i1, a_j, c, res_i2);
      uint32_t a_i2 = ab[4U * i + 3U];
      uint32_t *res_i = res_j + 4U * i + 3U;
      c = Hacl_Bignum_Base_mul_wide_add2_u32(a_i2, a_j, c, res_i);
    }
    for (uint32_t i = i0 / 4U * 4U; i < i0; i++)
    {
      uint32_t a_i = ab[i];
      uint32_t *res_i = res_j + i;
      c = Hacl_Bignum_Base_mul_wide_add2_u32(a_i, a_j, c, res_i);
    }
    uint32_t r = c;
    res[i0 + i0] = r;);
  uint32_t c0 = Hacl_Bignum_Addition_bn_add_eq_len_u32(16U, res, res, res);
  KRML_MAYBE_UNUSED_VAR(c0);
  uint32_t tmp[16U] = { 0U };
  KRML_MAYBE_FOR8(i,
    0U,
    8U,
    1U,
    uint64_t res1 = (uint64_t)a[i] * (uint64_t)a[i];
    uint32_t hi = (uint32_t)(res1 >> 32U);
    uint32_t lo = (uint32_t)res1;
    tmp[2U * i] = lo;
    tmp[2U * i + 1U] = hi;);
  uint32_t c1 = Hacl_Bignum_Addition_bn_add_eq_len_u32(16U, res, tmp, res);
  KRML_MAYBE_UNUSED_VAR(c1);
}